

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O2

string * __thiscall
antlr::BaseAST::toStringTree_abi_cxx11_(string *__return_storage_ptr__,BaseAST *this)

{
  AST *pAVar1;
  ASTRefCount<antlr::AST> local_40 [4];
  ASTRefCount<antlr::AST> local_20;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)local_40);
  (*(this->super_AST)._vptr_AST[0xd])(local_40,this);
  if (local_40[0].ref == (ASTRef *)0x0) {
    ASTRefCount<antlr::AST>::~ASTRefCount(local_40);
  }
  else {
    pAVar1 = (local_40[0].ref)->ptr;
    ASTRefCount<antlr::AST>::~ASTRefCount(local_40);
    if (pAVar1 != (AST *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      (*(this->super_AST)._vptr_AST[0x18])(local_40,this);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_40);
      (*(this->super_AST)._vptr_AST[0xd])(&local_20,this);
      (*(local_20.ref)->ptr->_vptr_AST[0x19])(local_40);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_40);
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_20);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  (*(this->super_AST)._vptr_AST[0x18])(local_40,this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string BaseAST::toStringTree() const
{
	ANTLR_USE_NAMESPACE(std)string ts = "";

	if (getFirstChild())
	{
		ts+=" ( ";
		ts+=toString();
		ts+=getFirstChild()->toStringList();
		ts+=" )";
	}
	else
	{
		ts+=" ";
		ts+=toString();
	}
	return ts;
}